

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  bool bVar1;
  PromiseFulfiller<void> *pPVar2;
  reference pvVar3;
  long in_RSI;
  Type local_68;
  TimePoint time;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_40;
  undefined1 local_29;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_28;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f6091;
  NetworkAddressHttpClient *this_local;
  
  this_local = this;
  bVar1 = std::
          deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
          ::empty((deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                   *)(in_RSI + 0x78));
  if (bVar1) {
    *(undefined1 *)(in_RSI + 0x6c) = 0;
    if ((*(int *)(in_RSI + 0x68) == 0) &&
       (f = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                      ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                       (in_RSI + 0x58)), f != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0
       )) {
      local_28 = f;
      pPVar2 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(f);
      (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_29);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x58),
                 &local_40);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_40);
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    pvVar3 = std::
             deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
             ::front((deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                      *)(in_RSI + 0x78));
    local_68.time.value.value =
         (Quantity<long,_kj::_::NanosecondLabel>)(pvVar3->expires).value.value;
    (**(code **)(**(long **)(in_RSI + 8) + 8))
              (&local_68,*(long **)(in_RSI + 8),local_68.time.value.value);
    Promise<void>::
    then<kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::_lambda()_1_>
              ((Promise<void> *)this,&local_68);
    Promise<void>::~Promise((Promise<void> *)&local_68);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_SOME(f, drainedFulfiller) {
          f->fulfill();
          drainedFulfiller = kj::none;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }